

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool CyclicKeyTest<Blob<256>>(pfHash hash,int cycleLen,int cycleReps,int keycount,bool drawDiagram)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t *blob;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  Rand r;
  
  printf("Keyset \'Cyclic\' - %d cycles of %d bytes - %d keys\n",(ulong)(uint)cycleReps,
         (ulong)(uint)cycleLen);
  Rand::reseed(&r,0x7618b);
  hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::resize(&hashes,(long)keycount);
  iVar2 = cycleLen + 0x10;
  if (cycleLen < -0x10) {
    iVar2 = -1;
  }
  blob = (uint32_t *)operator_new__((long)iVar2);
  uVar7 = cycleReps * cycleLen;
  uVar6 = 0xffffffff;
  if (-1 < (int)uVar7) {
    uVar6 = uVar7;
  }
  pvVar4 = operator_new__((long)(int)uVar6);
  for (uVar8 = 0; uVar8 != (uint)(~(keycount >> 0x1f) & keycount); uVar8 = uVar8 + 1) {
    Rand::rand_p(&r,blob,cycleLen);
    uVar3 = f3mix((uint)uVar8 ^ 0x746a94f1);
    *blob = uVar3;
    for (uVar5 = 0; (~((int)uVar7 >> 0x1f) & uVar7) != uVar5; uVar5 = uVar5 + 1) {
      *(undefined1 *)((long)pvVar4 + uVar5) =
           *(undefined1 *)
            ((long)blob +
            ((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) % (long)cycleLen
            & 0xffffffffU));
    }
    (*hash)(pvVar4,uVar7,0,
            hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8);
  }
  bVar1 = TestHashList<Blob<256>>(&hashes,drawDiagram,true,true,true,true);
  putchar(10);
  operator_delete__(blob);
  operator_delete__(pvVar4);
  std::_Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>);
  return bVar1;
}

Assistant:

bool CyclicKeyTest ( pfHash hash, int cycleLen, int cycleReps, const int keycount, bool drawDiagram )
{
  printf("Keyset 'Cyclic' - %d cycles of %d bytes - %d keys\n",cycleReps,cycleLen,keycount);

  Rand r(483723);

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  int keyLen = cycleLen * cycleReps;

  uint8_t * cycle = new uint8_t[cycleLen + 16];
  uint8_t * key = new uint8_t[keyLen];

  //----------

  for(int i = 0; i < keycount; i++)
  {
    r.rand_p(cycle,cycleLen);

    *(uint32_t*)cycle = f3mix(i ^ 0x746a94f1);

    for(int j = 0; j < keyLen; j++)
    {
      key[j] = cycle[j % cycleLen];
    }

    hash(key,keyLen,0,&hashes[i]);
  }

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  delete [] cycle;
  delete [] key;

  return result;
}